

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_bin.h
# Opt level: O0

cache_bin_sz_t cache_bin_low_water_get(cache_bin_t *bin)

{
  cache_bin_sz_t cVar1;
  cache_bin_t *in_RDI;
  cache_bin_sz_t low_water;
  
  cVar1 = cache_bin_low_water_get_internal((cache_bin_t *)0x2589613);
  cache_bin_assert_earlier(in_RDI,(uint16_t)in_RDI->stack_head,in_RDI->low_bits_low_water);
  return cVar1;
}

Assistant:

static inline cache_bin_sz_t
cache_bin_low_water_get(cache_bin_t *bin) {
	cache_bin_sz_t low_water = cache_bin_low_water_get_internal(bin);
	assert(low_water <= cache_bin_ncached_max_get(bin));
	assert(low_water <= cache_bin_ncached_get_local(bin));

	cache_bin_assert_earlier(bin, (uint16_t)(uintptr_t)bin->stack_head,
	    bin->low_bits_low_water);

	return low_water;
}